

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O1

uchar * Cnf_DataDeriveLitPolarities(Cnf_Dat_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int **ppiVar5;
  uint *puVar6;
  uint *puVar7;
  long lVar8;
  void *__ptr;
  void *__ptr_00;
  uchar *puVar9;
  uint *puVar10;
  ulong uVar11;
  void *pvVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  size_t __nmemb;
  
  __nmemb = (size_t)p->pMan->vObjs->nSize;
  __ptr = calloc(__nmemb,4);
  __ptr_00 = calloc(__nmemb,4);
  puVar9 = (uchar *)calloc((long)p->nClauses,1);
  if (0 < (long)__nmemb) {
    piVar4 = p->pObj2Count;
    sVar13 = 0;
    do {
      iVar1 = piVar4[sVar13];
      if ((long)iVar1 != 0) {
        lVar14 = (long)p->pObj2Clause[sVar13];
        lVar15 = lVar14 + iVar1;
        if (0 < iVar1) {
          ppiVar5 = p->pClauses;
          lVar16 = lVar14;
          do {
            puVar6 = (uint *)ppiVar5[lVar16];
            puVar7 = (uint *)ppiVar5[lVar16 + 1];
            puVar10 = puVar6 + 1;
            if (puVar10 < puVar7) {
              uVar2 = *puVar6;
              if ((int)uVar2 < 0) goto LAB_0055bfa5;
              do {
                uVar3 = *puVar10;
                pvVar12 = __ptr;
                if ((uVar2 & 1) == 0) {
                  pvVar12 = __ptr_00;
                }
                if ((int)uVar3 < 0) goto LAB_0055bfa5;
                puVar6 = (uint *)((long)pvVar12 + (ulong)(uVar3 >> 1) * 4);
                *puVar6 = *puVar6 | 2 - (uVar3 & 1);
                puVar10 = puVar10 + 1;
              } while (puVar10 < puVar7);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < lVar15);
        }
        lVar15 = (long)(int)lVar15;
        if (0 < iVar1) {
          ppiVar5 = p->pClauses;
          lVar16 = lVar14;
          do {
            puVar10 = (uint *)ppiVar5[lVar16];
            puVar6 = (uint *)ppiVar5[lVar16 + 1];
            if (puVar10 + 1 < puVar6) {
              uVar2 = *puVar10;
              if ((int)uVar2 < 0) {
LAB_0055bfa5:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              uVar11 = 4;
              do {
                pvVar12 = __ptr;
                if ((uVar2 & 1) == 0) {
                  pvVar12 = __ptr_00;
                }
                if ((int)*(uint *)((long)puVar10 + uVar11) < 0) goto LAB_0055bf86;
                puVar9[lVar16] =
                     puVar9[lVar16] |
                     (byte)(*(int *)((long)pvVar12 +
                                    (ulong)(*(uint *)((long)puVar10 + uVar11) >> 1) * 4) <<
                           ((char)(uVar11 >> 1) - 2U & 0x1f));
                lVar8 = uVar11 + 4;
                uVar11 = uVar11 + 4;
              } while ((uint *)((long)puVar10 + lVar8) < puVar6);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < lVar15);
        }
        if (0 < iVar1) {
          ppiVar5 = p->pClauses;
          do {
            puVar10 = (uint *)ppiVar5[lVar14];
            puVar6 = (uint *)ppiVar5[lVar14 + 1];
            while (puVar10 = puVar10 + 1, puVar10 < puVar6) {
              if ((int)*puVar10 < 0) {
LAB_0055bf86:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              uVar11 = (ulong)(*puVar10 >> 1);
              *(undefined4 *)((long)__ptr_00 + uVar11 * 4) = 0;
              *(undefined4 *)((long)__ptr + uVar11 * 4) = 0;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < lVar15);
        }
      }
      sVar13 = sVar13 + 1;
    } while (sVar13 != __nmemb);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  return puVar9;
}

Assistant:

unsigned char * Cnf_DataDeriveLitPolarities( Cnf_Dat_t * p )
{
    int i, c, iClaBeg, iClaEnd, * pLit;
    unsigned * pPols0 = ABC_CALLOC( unsigned, Aig_ManObjNumMax(p->pMan) );
    unsigned * pPols1 = ABC_CALLOC( unsigned, Aig_ManObjNumMax(p->pMan) );
    unsigned char * pPres = ABC_CALLOC( unsigned char, p->nClauses );
    for ( i = 0; i < Aig_ManObjNumMax(p->pMan); i++ )
    {
        if ( p->pObj2Count[i] == 0 )
            continue;
        iClaBeg = p->pObj2Clause[i];
        iClaEnd = p->pObj2Clause[i] + p->pObj2Count[i];
        // go through the negative polarity clauses
        for ( c = iClaBeg; c < iClaEnd; c++ )
            for ( pLit = p->pClauses[c]+1; pLit < p->pClauses[c+1]; pLit++ )
                if ( Abc_LitIsCompl(p->pClauses[c][0]) )
                    pPols0[Abc_Lit2Var(*pLit)] |= (unsigned)(2 - Abc_LitIsCompl(*pLit));  // taking the opposite (!) -- not the case
                else
                    pPols1[Abc_Lit2Var(*pLit)] |= (unsigned)(2 - Abc_LitIsCompl(*pLit));  // taking the opposite (!) -- not the case
        // record these clauses
        for ( c = iClaBeg; c < iClaEnd; c++ )
            for ( pLit = p->pClauses[c]+1; pLit < p->pClauses[c+1]; pLit++ )
                if ( Abc_LitIsCompl(p->pClauses[c][0]) )
                    pPres[c] = (unsigned char)( (unsigned)pPres[c] | (pPols0[Abc_Lit2Var(*pLit)] << (2*(pLit-p->pClauses[c]-1))) );
                else
                    pPres[c] = (unsigned char)( (unsigned)pPres[c] | (pPols1[Abc_Lit2Var(*pLit)] << (2*(pLit-p->pClauses[c]-1))) );
        // clean negative polarity
        for ( c = iClaBeg; c < iClaEnd; c++ )
            for ( pLit = p->pClauses[c]+1; pLit < p->pClauses[c+1]; pLit++ )
                pPols0[Abc_Lit2Var(*pLit)] = pPols1[Abc_Lit2Var(*pLit)] = 0;
    }
    ABC_FREE( pPols0 );
    ABC_FREE( pPols1 );
/*
//    for ( c = 0; c < p->nClauses; c++ )
    for ( c = 0; c < 100; c++ )
    {
        printf( "Clause %6d : ", c );
        for ( i = 0; i < 4; i++ )
            printf( "%d ", ((unsigned)pPres[c] >> (2*i)) & 3 );
        printf( "  " );
        for ( pLit = p->pClauses[c]; pLit < p->pClauses[c+1]; pLit++ )
            printf( "%6d ", *pLit );
        printf( "\n" );
    }
*/
    return pPres;
}